

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linkedlist_add_front.c
# Opt level: O3

int linkedlist_add_front(s_linkedlist *linked_list,void *element)

{
  s_linkedlist_node *psVar1;
  int iVar2;
  s_linkedlist_node *psVar3;
  
  psVar3 = (s_linkedlist_node *)calloc(1,0x18);
  if (psVar3 == (s_linkedlist_node *)0x0) {
    iVar2 = -1;
  }
  else {
    psVar3->element = element;
    psVar1 = linked_list->head;
    if (psVar1 != (s_linkedlist_node *)0x0) {
      psVar3->next = psVar1;
      psVar1->previous = psVar3;
    }
    linked_list->head = psVar3;
    if (linked_list->tail == (s_linkedlist_node *)0x0) {
      linked_list->tail = psVar3;
    }
    linked_list->size = linked_list->size + 1;
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

int linkedlist_add_front(s_linkedlist *linked_list, void *element) {
    s_linkedlist_node *node = malloc(sizeof(s_linkedlist_node));
    if (node == NULL) {
        return (LINKEDLIST_RETVAL_FAILURE);
    }

    memset(node, 0, sizeof(s_linkedlist_node));

    node->element = element;

    if (linked_list->head == NULL) {
        linked_list->head = node;
    } else {
        node->next                  = linked_list->head;
        linked_list->head->previous = node;
        linked_list->head           = node;
    }

    if (linked_list->tail == NULL) {
        linked_list->tail = node;
    }

    linked_list->size += 1;

    return (LINKEDLIST_RETVAL_SUCCESS);
}